

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O3

void prvTidytidyMessageRelease(TidyMessageImpl *message)

{
  TidyAllocator *pTVar1;
  
  if (message != (TidyMessageImpl *)0x0) {
    pTVar1 = message->tidyDoc->allocator;
    (*pTVar1->vtbl->free)(pTVar1,message->arguments);
    pTVar1 = message->tidyDoc->allocator;
    (*pTVar1->vtbl->free)(pTVar1,message->messageDefault);
    pTVar1 = message->tidyDoc->allocator;
    (*pTVar1->vtbl->free)(pTVar1,message->message);
    pTVar1 = message->tidyDoc->allocator;
    (*pTVar1->vtbl->free)(pTVar1,message->messagePosDefault);
    pTVar1 = message->tidyDoc->allocator;
    (*pTVar1->vtbl->free)(pTVar1,message->messagePos);
    pTVar1 = message->tidyDoc->allocator;
    (*pTVar1->vtbl->free)(pTVar1,message->messageOutputDefault);
    pTVar1 = message->tidyDoc->allocator;
    (*pTVar1->vtbl->free)(pTVar1,message->messageOutput);
    pTVar1 = message->tidyDoc->allocator;
    (*pTVar1->vtbl->free)(pTVar1,message);
    return;
  }
  return;
}

Assistant:

void TY_(tidyMessageRelease)( TidyMessageImpl *message )
{
    if ( !message )
        return;
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->arguments );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->messageDefault );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->message );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->messagePosDefault );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->messagePos );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->messageOutputDefault );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->messageOutput );
    TidyDocFree(tidyDocToImpl(message->tidyDoc), message); /* Issue #597 - and discard the message structure */
}